

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Element.cpp
# Opt level: O3

void __thiscall Rml::Element::SetBox(Element *this,Box *box)

{
  pointer pPVar1;
  pointer pPVar2;
  float fVar3;
  float fVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  bool bVar8;
  long lVar9;
  pointer this_00;
  float fVar10;
  float fVar11;
  String local_68;
  BoxEdge local_48 [6];
  
  bVar8 = Box::operator!=(box,&this->main_box);
  if ((bVar8) ||
     ((this->additional_boxes).
      super__Vector_base<Rml::Element::PositionedBox,_std::allocator<Rml::Element::PositionedBox>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (this->additional_boxes).
      super__Vector_base<Rml::Element::PositionedBox,_std::allocator<Rml::Element::PositionedBox>_>.
      _M_impl.super__Vector_impl_data._M_start)) {
    local_48[0] = Top;
    local_48[1] = Right;
    local_48[2] = Bottom;
    local_48[3] = Left;
    lVar9 = 0;
    do {
      fVar10 = Box::GetEdge(box,Border,*(BoxEdge *)((long)local_48 + lVar9));
      fVar11 = Math::Round(fVar10);
      if ((fVar10 != fVar11) || (NAN(fVar10) || NAN(fVar11))) {
        GetAddress_abi_cxx11_(&local_68,this,false,true);
        Log::Message(LT_WARNING,"Expected integer border width but got %g px on element: %s",
                     SUB84((double)fVar10,0),local_68._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_dataplus._M_p != &local_68.field_2) {
          operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
        }
      }
      lVar9 = lVar9 + 4;
    } while (lVar9 != 0x10);
    *(undefined8 *)((this->main_box).area_edges[2] + 2) = *(undefined8 *)(box->area_edges[2] + 2);
    fVar10 = (box->content).x;
    fVar11 = (box->content).y;
    fVar3 = box->area_edges[0][0];
    fVar4 = box->area_edges[0][1];
    uVar5 = *(undefined8 *)(box->area_edges[0] + 2);
    uVar6 = *(undefined8 *)box->area_edges[1];
    uVar7 = *(undefined8 *)box->area_edges[2];
    *(undefined8 *)((this->main_box).area_edges[1] + 2) = *(undefined8 *)(box->area_edges[1] + 2);
    *(undefined8 *)(this->main_box).area_edges[2] = uVar7;
    *(undefined8 *)((this->main_box).area_edges[0] + 2) = uVar5;
    *(undefined8 *)(this->main_box).area_edges[1] = uVar6;
    (this->main_box).content.x = fVar10;
    (this->main_box).content.y = fVar11;
    (this->main_box).area_edges[0][0] = fVar3;
    (this->main_box).area_edges[0][1] = fVar4;
    pPVar1 = (this->additional_boxes).
             super__Vector_base<Rml::Element::PositionedBox,_std::allocator<Rml::Element::PositionedBox>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pPVar2 = (this->additional_boxes).
             super__Vector_base<Rml::Element::PositionedBox,_std::allocator<Rml::Element::PositionedBox>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    this_00 = pPVar1;
    if (pPVar2 != pPVar1) {
      do {
        Box::~Box(&this_00->box);
        this_00 = this_00 + 1;
      } while (this_00 != pPVar2);
      (this->additional_boxes).
      super__Vector_base<Rml::Element::PositionedBox,_std::allocator<Rml::Element::PositionedBox>_>.
      _M_impl.super__Vector_impl_data._M_finish = pPVar1;
    }
    (*(this->super_ScriptInterface).super_Releasable._vptr_Releasable[0xc])(this);
    this->field_0x17 = this->field_0x17 | 1;
    ElementBackgroundBorder::DirtyBackground(&this->meta->background_border);
    ElementBackgroundBorder::DirtyBorder(&this->meta->background_border);
    ElementEffects::DirtyEffectsData(&this->meta->effects);
  }
  return;
}

Assistant:

void Element::SetBox(const Box& box)
{
	if (box != main_box || additional_boxes.size() > 0)
	{
#ifdef RMLUI_DEBUG
		for (const BoxEdge edge : {BoxEdge::Top, BoxEdge::Right, BoxEdge::Bottom, BoxEdge::Left})
		{
			const float border_width = box.GetEdge(BoxArea::Border, edge);
			if (border_width != Math::Round(border_width))
				Log::Message(Log::LT_WARNING, "Expected integer border width but got %g px on element: %s", border_width, GetAddress().c_str());
		}
#endif

		main_box = box;
		additional_boxes.clear();

		OnResize();
		rounded_main_padding_size_dirty = true;
		meta->background_border.DirtyBackground();
		meta->background_border.DirtyBorder();
		meta->effects.DirtyEffectsData();
	}
}